

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::SetMinVersion(CWallet *this,WalletFeature nVersion,WalletBatch *batch_in)

{
  WalletDatabase *pWVar1;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var2;
  WalletBatch *this_00;
  WalletFeature nVersion_00;
  pointer *__ptr;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  WalletFeature local_44;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_40._M_owns = false;
  local_44 = nVersion;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  if (this->nWalletVersion < (int)nVersion) {
    WalletLogPrintf<wallet::WalletFeature>(this,(ConstevalFormatString<1U>)0x488d9e,&local_44);
    this->nWalletVersion = local_44;
    this_00 = batch_in;
    nVersion_00 = local_44;
    if (batch_in == (WalletBatch *)0x0) {
      this_00 = (WalletBatch *)operator_new(0x10);
      pWVar1 = (this->m_database)._M_t.
               super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
               ._M_t.
               super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
               .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      if (pWVar1 == (WalletDatabase *)0x0) {
        __assert_fail("static_cast<bool>(m_database)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
      }
      (*pWVar1->_vptr_WalletDatabase[0xe])(this_00,pWVar1,1);
      this_00->m_database = pWVar1;
      nVersion_00 = this->nWalletVersion;
    }
    if (40000 < (int)nVersion_00) {
      WalletBatch::WriteMinVersion(this_00,nVersion_00);
    }
    if (batch_in == (WalletBatch *)0x0) {
      _Var2._M_head_impl =
           (this_00->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      if (_Var2._M_head_impl != (DatabaseBatch *)0x0) {
        (*(_Var2._M_head_impl)->_vptr_DatabaseBatch[5])();
      }
      operator_delete(this_00,0x10);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::SetMinVersion(enum WalletFeature nVersion, WalletBatch* batch_in)
{
    LOCK(cs_wallet);
    if (nWalletVersion >= nVersion)
        return;
    WalletLogPrintf("Setting minversion to %d\n", nVersion);
    nWalletVersion = nVersion;

    {
        WalletBatch* batch = batch_in ? batch_in : new WalletBatch(GetDatabase());
        if (nWalletVersion > 40000)
            batch->WriteMinVersion(nWalletVersion);
        if (!batch_in)
            delete batch;
    }
}